

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_discover.cc
# Opt level: O3

int runDiscover(string *command,int argc,char **argv)

{
  undefined8 uVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool print_header;
  bool iponly;
  bool serialonly;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  DeviceInfo *extraout_RDX;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  __it2;
  DeviceInfo *extraout_RDX_00;
  DeviceInfo *extraout_RDX_01;
  DeviceInfo *extraout_RDX_02;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  _Var11;
  DeviceInfo *info;
  pointer pDVar12;
  iterator __last;
  pointer pDVar13;
  DeviceInfo *this;
  DeviceInfo *this_00;
  iterator __first;
  int iVar14;
  string *psVar15;
  DeviceInfo *pDVar16;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> infos;
  Discover discover;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> filtered_infos;
  DeviceFilter device_filter;
  int local_124;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_118;
  string *local_100;
  undefined1 local_f8 [48];
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_c8;
  DeviceFilter local_a8;
  
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  print_header = true;
  iVar14 = 0;
  serialonly = false;
  iponly = false;
  local_100 = command;
  while (iVar14 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,argv[iVar14],(allocator<char> *)&local_118);
    iVar14 = iVar14 + 1;
    iVar6 = std::__cxx11::string::compare((char *)local_f8);
    bVar5 = true;
    if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_f8), iVar6 == 0)) {
      print_header = false;
      iponly = true;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)local_f8);
      bVar5 = true;
      if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_f8), iVar6 == 0)) {
        print_header = false;
        serialonly = true;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)local_f8);
        if (iVar6 == 0) {
          iVar6 = parseFilterArguments(argc - iVar14,argv + iVar14,&local_a8);
          iVar14 = iVar14 + iVar6;
          print_header = false;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)local_f8);
          if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_f8), iVar6 == 0))
          {
            bVar5 = false;
            printHelp((ostream *)&std::cout,(string *)(local_100->_M_dataplus)._M_p);
            local_124 = 0;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Invalid argument: ",0x12);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_f8._0_8_,local_f8._8_8_);
            local_118.
            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_118.
                                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_118,1);
            printHelp((ostream *)&std::cerr,(string *)(local_100->_M_dataplus)._M_p);
            local_124 = 1;
            bVar5 = false;
          }
        }
      }
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      (ulong)((long)&(((Socket<rcdiscover::SocketLinux> *)local_f8._16_8_)->
                                     iface_name_)._M_dataplus._M_p + 1));
    }
    if (!bVar5) goto LAB_0010df57;
  }
  rcdiscover::Discover::Discover((Discover *)local_f8);
  rcdiscover::Discover::broadcastRequest((Discover *)local_f8);
  local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (DeviceInfo *)0x0;
  local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (DeviceInfo *)0x0;
  local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  lVar9 = lVar8;
  while ((bVar5 = rcdiscover::Discover::getResponse((Discover *)local_f8,&local_118,100),
         pDVar13 = local_118.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
         pDVar12 = local_118.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start, bVar5 ||
         ((double)(lVar9 - lVar8) / 1000000.0 < 1000.0))) {
    lVar9 = std::chrono::_V2::steady_clock::now();
  }
  __last._M_current =
       local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __first._M_current =
       local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar10 = (long)local_118.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_118.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 8;
    lVar9 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_118.
               super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_118.
               super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pDVar12,pDVar13);
    __last._M_current =
         local_118.
         super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl
         .super__Vector_impl_data._M_finish;
    __it2._M_current = extraout_RDX;
    _Var11._M_current =
         local_118.
         super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl
         .super__Vector_impl_data._M_start;
    __first._M_current = __last._M_current;
    if (local_118.
        super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_118.
        super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        this_00 = _Var11._M_current;
        _Var11._M_current = this_00 + 1;
        if (_Var11._M_current == __last._M_current) goto LAB_0010de9b;
        bVar5 = __gnu_cxx::__ops::
                _Iter_comp_iter<runDiscover(std::__cxx11::string_const&,int,char**)::$_0>::
                operator()(this_00,_Var11,__it2);
        __it2._M_current = extraout_RDX_00;
      } while (!bVar5);
      pDVar12 = __last._M_current;
      if (this_00 + 2 != __last._M_current) {
        _Var11._M_current = extraout_RDX_00;
        this = this_00;
        psVar15 = (string *)&this_00[2].user_name;
        do {
          bVar5 = __gnu_cxx::__ops::
                  _Iter_comp_iter<runDiscover(std::__cxx11::string_const&,int,char**)::$_0>::
                  operator()(this,(DeviceInfo *)(psVar15 + -0xe0),_Var11);
          _Var11._M_current = extraout_RDX_01;
          this_00 = this;
          if (!bVar5) {
            this_00 = this + 1;
            std::__cxx11::string::operator=((string *)this_00,psVar15 + -0xe0);
            uVar1 = *(undefined8 *)(psVar15 + -0xc0);
            uVar2 = *(uint64_t *)(psVar15 + -0xb8);
            uVar3 = *(undefined8 *)(psVar15 + -0xb4);
            uVar4 = *(undefined8 *)(psVar15 + -0xac);
            this[1].major = (int)uVar1;
            this[1].minor = (int)((ulong)uVar1 >> 0x20);
            this[1].mac = uVar2;
            *(undefined8 *)((long)&this[1].mac + 4) = uVar3;
            this[1].subnet = (int)uVar4;
            this[1].gateway = (int)((ulong)uVar4 >> 0x20);
            std::__cxx11::string::operator=((string *)&this[1].manufacturer_name,psVar15 + -0xa0);
            std::__cxx11::string::operator=((string *)&this[1].model_name,psVar15 + -0x80);
            std::__cxx11::string::operator=((string *)&this[1].device_version,psVar15 + -0x60);
            std::__cxx11::string::operator=((string *)&this[1].manufacturer_info,psVar15 + -0x40);
            std::__cxx11::string::operator=((string *)&this[1].serial_number,psVar15 + -0x20);
            std::__cxx11::string::operator=((string *)&this[1].user_name,psVar15);
            _Var11._M_current = extraout_RDX_02;
          }
          pDVar16 = (DeviceInfo *)(psVar15 + 0x20);
          pDVar12 = local_118.
                    super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          this = this_00;
          psVar15 = psVar15 + 0x100;
        } while (pDVar16 != __last._M_current);
      }
      __last._M_current = pDVar12;
      __first._M_current = this_00 + 1;
    }
  }
LAB_0010de9b:
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::_M_erase
            (&local_118,__first,__last);
  pDVar12 = local_118.
            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_c8.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pDVar13 = local_118.
              super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      if ((pDVar13->mac != 0) && (bVar5 = filterDevice(pDVar13,&local_a8), bVar5)) {
        std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::push_back
                  (&local_c8,pDVar13);
      }
      pDVar13 = pDVar13 + 1;
    } while (pDVar13 != pDVar12);
  }
  printDeviceTable((ostream *)&std::cout,&local_c8,print_header,iponly,serialonly);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector(&local_c8);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector(&local_118);
  rcdiscover::Discover::~Discover((Discover *)local_f8);
  local_124 = 0;
LAB_0010df57:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.model);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.iface);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.mac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.serial);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.name);
  return local_124;
}

Assistant:

int runDiscover(const std::string &command, int argc, char **argv)
{
  // interpret command line parameters

  bool printheader = true;
  bool iponly = false;
  bool serialonly = false;
  DeviceFilter device_filter;

  int i = 0;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-iponly" || p == "--iponly")
    {
      iponly = true;
      printheader = false;
    }
    else if (p == "-serialonly" || p == "--serialonly")
    {
      serialonly = true;
      printheader = false;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        return 1;
      }

      printheader = false;
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
  }

  // broadcast discover request

  rcdiscover::Discover discover;
  discover.broadcastRequest();

  std::vector<rcdiscover::DeviceInfo> infos;

  // get all responses, sort them and remove multiple entries

  std::chrono::steady_clock::time_point tstart=std::chrono::steady_clock::now();
  std::chrono::steady_clock::time_point tend=tstart;

  while (discover.getResponse(infos, 100) ||
    std::chrono::duration<double, std::milli>(tend-tstart).count() < 1000)
  {
    tend=std::chrono::steady_clock::now();
  }

  std::sort(infos.begin(), infos.end());
  const auto it = std::unique(infos.begin(), infos.end(),
                              [](const rcdiscover::DeviceInfo &lhs,
                                 const rcdiscover::DeviceInfo &rhs)
                              {
                                return lhs.getMAC() == rhs.getMAC() &&
                                       lhs.getIfaceName() == rhs.getIfaceName();
                              });
  infos.erase(it, infos.end());

  // go through all valid entries

  std::vector<rcdiscover::DeviceInfo> filtered_infos;
  for (rcdiscover::DeviceInfo &info : infos)
  {
    if (!info.isValid())
    {
      continue;
    }

    // filter as requested
    if (!filterDevice(info, device_filter)) continue;

    filtered_infos.push_back(info);
  }

  printDeviceTable(std::cout, filtered_infos, printheader, iponly, serialonly);

  return 0;
}